

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockContextRebuildNodes(ImGuiContext_conflict *ctx)

{
  ImGuiID root_id;
  ImGuiDockContext *dc;
  ImGuiContext_conflict *ctx_local;
  
  SaveIniSettingsToMemory((size_t *)0x0);
  DockContextClearNodes(ctx,0,false);
  DockContextBuildNodesFromSettings
            (ctx,(ctx->DockContext).NodesSettings.Data,(ctx->DockContext).NodesSettings.Size);
  DockContextBuildAddWindowsToNodes(ctx,0);
  return;
}

Assistant:

void ImGui::DockContextRebuildNodes(ImGuiContext* ctx)
{
    IMGUI_DEBUG_LOG_DOCKING("DockContextRebuild()\n");
    ImGuiDockContext* dc  = &ctx->DockContext;
    SaveIniSettingsToMemory();
    ImGuiID root_id = 0; // Rebuild all
    DockContextClearNodes(ctx, root_id, false);
    DockContextBuildNodesFromSettings(ctx, dc->NodesSettings.Data, dc->NodesSettings.Size);
    DockContextBuildAddWindowsToNodes(ctx, root_id);
}